

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O2

bool testLoadUnstructuredL2(bool verbose,int gpu_id)

{
  ostream *poVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,verbose) != 0) {
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
    poVar1 = std::operator<<((ostream *)&std::cout,"blas   ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x1e;
    poVar1 = std::operator<<(poVar1,"unstructured construction");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
    poVar1 = std::operator<<(poVar1,"Pass");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)&std::cout,"testLoadUnstructuredL2() requires BLAS or CUDA\n");
  }
  return true;
}

Assistant:

bool testLoadUnstructuredL2(bool verbose, int gpu_id){
    #ifdef Tasmanian_ENABLE_DPCPP
    test_queue.init_testing(gpu_id);
    #endif
    bool pass = true;

    bool blas_pass = (AccelerationMeta::isAvailable(accel_cpu_blas)) ? runTests(accel_cpu_blas, verbose, 0) : true;
    if (blas_pass){
        if (verbose) cout << std::setw(10) << "blas   " << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
    }else{
        cout << "Failed testLoadUnstructuredL2() blas case.\n";
    }
    pass = pass and blas_pass;

    if (AccelerationMeta::isAvailable(accel_gpu_cuda)){
        int gpu_begin = (gpu_id == -1) ? 0 : gpu_id;
        int gpu_end   = (gpu_id == -1) ? TasmanianSparseGrid::getNumGPUs() : gpu_id + 1;
        for(int gpu = gpu_begin; gpu < gpu_end; gpu++){
            bool cublas_pass = runTests(accel_gpu_cublas, verbose, gpu);
            if (cublas_pass){
                if (verbose) cout << std::setw(7) << "cublas" << std::setw(3) << gpu << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
            }else{
                cout << "Failed testLoadUnstructuredL2() cublas case on device " << gpu << "\n";
            }
            bool cuda_pass = runTests(accel_gpu_cuda, verbose, gpu);
            if (cuda_pass){
                if (verbose) cout << std::setw(7) << "cuda" << std::setw(3) << gpu << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
            }else{
                cout << "Failed testLoadUnstructuredL2() cuda case on device " << gpu << "\n";
            }
            pass = pass and cuda_pass;
            if (AccelerationMeta::isAvailable(accel_gpu_magma)){
                bool magma_pass = runTests(accel_gpu_magma, verbose, gpu);
                if (magma_pass){
                    if (verbose) cout << std::setw(7) << "magma" << std::setw(3) << gpu
                                      << std::setw(30) << "unstructured construction" << std::setw(10) << "Pass" << endl;
                }else{
                    cout << "Failed testLoadUnstructuredL2() magma case on device " << gpu << "\n";
                }
                pass = pass and magma_pass;
            }
        }
    }

    if (verbose and not AccelerationMeta::isAvailable(accel_cpu_blas) and not AccelerationMeta::isAvailable(accel_gpu_cuda))
        cout << "testLoadUnstructuredL2() requires BLAS or CUDA\n";

    return pass;
}